

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strict_fstream.hpp
# Opt level: O3

void strict_fstream::detail::static_method_holder::check_mode(string *filename,openmode mode)

{
  Exception *pEVar1;
  long *plVar2;
  size_type *psVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if ((mode & _S_trunc) == ~(_S_ios_openmode_min|_S_ios_openmode_max)) {
    if ((mode & (_S_out|_S_app)) == _S_app) {
      pEVar1 = (Exception *)__cxa_allocate_exception(0x28);
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,"strict_fstream: open(\'","");
      std::operator+(&local_48,&local_88,filename);
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_48);
      local_68._M_dataplus._M_p = (pointer)*plVar2;
      psVar3 = (size_type *)(plVar2 + 2);
      if ((size_type *)local_68._M_dataplus._M_p == psVar3) {
        local_68.field_2._M_allocated_capacity = *psVar3;
        local_68.field_2._8_8_ = plVar2[3];
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      }
      else {
        local_68.field_2._M_allocated_capacity = *psVar3;
      }
      local_68._M_string_length = plVar2[1];
      *plVar2 = (long)psVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      Exception::Exception(pEVar1,&local_68);
      __cxa_throw(pEVar1,&Exception::typeinfo,Exception::~Exception);
    }
  }
  else {
    if ((mode & _S_out) == ~(_S_ios_openmode_min|_S_ios_openmode_max)) {
      pEVar1 = (Exception *)__cxa_allocate_exception(0x28);
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,"strict_fstream: open(\'","");
      std::operator+(&local_48,&local_88,filename);
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_48);
      local_68._M_dataplus._M_p = (pointer)*plVar2;
      psVar3 = (size_type *)(plVar2 + 2);
      if ((size_type *)local_68._M_dataplus._M_p == psVar3) {
        local_68.field_2._M_allocated_capacity = *psVar3;
        local_68.field_2._8_8_ = plVar2[3];
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      }
      else {
        local_68.field_2._M_allocated_capacity = *psVar3;
      }
      local_68._M_string_length = plVar2[1];
      *plVar2 = (long)psVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      Exception::Exception(pEVar1,&local_68);
      __cxa_throw(pEVar1,&Exception::typeinfo,Exception::~Exception);
    }
    if ((mode & _S_app) != ~(_S_ios_openmode_min|_S_ios_openmode_max)) {
      pEVar1 = (Exception *)__cxa_allocate_exception(0x28);
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,"strict_fstream: open(\'","");
      std::operator+(&local_48,&local_88,filename);
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_48);
      local_68._M_dataplus._M_p = (pointer)*plVar2;
      psVar3 = (size_type *)(plVar2 + 2);
      if ((size_type *)local_68._M_dataplus._M_p == psVar3) {
        local_68.field_2._M_allocated_capacity = *psVar3;
        local_68.field_2._8_8_ = plVar2[3];
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      }
      else {
        local_68.field_2._M_allocated_capacity = *psVar3;
      }
      local_68._M_string_length = plVar2[1];
      *plVar2 = (long)psVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      Exception::Exception(pEVar1,&local_68);
      __cxa_throw(pEVar1,&Exception::typeinfo,Exception::~Exception);
    }
  }
  return;
}

Assistant:

static void check_mode(const std::string& filename, std::ios_base::openmode mode)
    {
        if ((mode & std::ios_base::trunc) && ! (mode & std::ios_base::out))
        {
            throw Exception(std::string("strict_fstream: open('") + filename + "'): mode error: trunc and not out");
        }
        else if ((mode & std::ios_base::app) && ! (mode & std::ios_base::out))
        {
            throw Exception(std::string("strict_fstream: open('") + filename + "'): mode error: app and not out");
        }
        else if ((mode & std::ios_base::trunc) && (mode & std::ios_base::app))
        {
            throw Exception(std::string("strict_fstream: open('") + filename + "'): mode error: trunc and app");
        }
     }